

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_Interval __thiscall
ON_PlaneEquation::ValueRange
          (ON_PlaneEquation *this,size_t point_index_count,size_t point_index_stride,
          uint *point_index_list,ON_3dPointListRef *point_list)

{
  double dVar1;
  double *pdVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  ON_Interval OVar19;
  
  dVar1 = this->x;
  dVar17 = ON_Interval::EmptyInterval.m_t[0];
  dVar15 = ON_Interval::EmptyInterval.m_t[1];
  if ((((ABS(dVar1) < 1.23432101234321e+308) && (ABS(this->y) < 1.23432101234321e+308)) &&
      (ABS(this->z) < 1.23432101234321e+308)) && (ABS(this->d) < 1.23432101234321e+308)) {
    uVar9 = point_list->m_point_count;
    uVar4 = (ulong)uVar9;
    if ((uVar4 != 0) &&
       (uVar8 = (uint)point_index_count,
       uVar8 != 0 && 0xffffffff00000001 < point_index_count - 0xffffffff)) {
      if (point_index_list == (uint *)0x0) {
        if (uVar8 - 1 < uVar9) {
          pdVar2 = point_list->m_dP;
          pfVar3 = point_list->m_fP;
          uVar11 = 0;
          uVar5 = 1;
          do {
            dVar17 = -1.23432101234321e+308;
            dVar16 = -1.23432101234321e+308;
            dVar14 = -1.23432101234321e+308;
            if (uVar5 - 1 < uVar4) {
              if (pdVar2 == (double *)0x0) {
                dVar17 = (double)pfVar3[uVar11];
                dVar16 = (double)pfVar3[uVar11 + 1];
                dVar14 = (double)pfVar3[uVar11 + 2];
              }
              else {
                dVar17 = pdVar2[uVar11];
                dVar16 = pdVar2[uVar11 + 1];
                dVar14 = pdVar2[uVar11 + 2];
              }
            }
            dVar17 = dVar14 * this->z + dVar17 * dVar1 + dVar16 * this->y + this->d;
            if (ABS(dVar17) < 1.23432101234321e+308) {
              dVar15 = dVar17;
              if ((uint)uVar5 < uVar8) {
                pdVar2 = point_list->m_dP;
                pfVar3 = point_list->m_fP;
                uVar9 = (uint)uVar5 * point_list->m_point_stride;
                dVar16 = dVar17;
                do {
                  dVar15 = -1.23432101234321e+308;
                  dVar14 = -1.23432101234321e+308;
                  dVar18 = -1.23432101234321e+308;
                  if (uVar5 < uVar4) {
                    if (pdVar2 == (double *)0x0) {
                      dVar15 = (double)pfVar3[uVar9];
                      dVar14 = (double)pfVar3[(ulong)uVar9 + 1];
                      dVar18 = (double)pfVar3[(ulong)uVar9 + 2];
                    }
                    else {
                      dVar15 = pdVar2[uVar9];
                      dVar14 = pdVar2[(ulong)uVar9 + 1];
                      dVar18 = pdVar2[(ulong)uVar9 + 2];
                    }
                  }
                  dVar15 = dVar18 * this->z + dVar15 * dVar1 + dVar14 * this->y + this->d;
                  dVar14 = dVar17;
                  if (((1.23432101234321e+308 <= ABS(dVar15)) || (dVar14 = dVar15, dVar15 < dVar17))
                     || (dVar14 = dVar17, dVar15 <= dVar16)) {
                    dVar17 = dVar14;
                    dVar15 = dVar16;
                  }
                  uVar5 = uVar5 + 1;
                  uVar9 = uVar9 + point_list->m_point_stride;
                  dVar16 = dVar15;
                } while (uVar8 != (uint)uVar5);
              }
              break;
            }
            uVar11 = (ulong)((int)uVar11 + point_list->m_point_stride);
            bVar12 = uVar5 != point_index_count;
            uVar5 = uVar5 + 1;
            dVar17 = ON_Interval::EmptyInterval.m_t[0];
          } while (bVar12);
        }
      }
      else {
        iVar6 = (int)point_index_stride;
        if ((iVar6 != 0 && point_index_stride - 1 >> 1 < 0x7fffffff) &&
           (uVar8 = iVar6 * uVar8, uVar8 != 0)) {
          pdVar2 = point_list->m_dP;
          pfVar3 = point_list->m_fP;
          uVar7 = 0;
          do {
            iVar10 = 6;
            if (point_index_list[uVar7] < uVar9) {
              uVar4 = (ulong)(point_index_list[uVar7] * point_list->m_point_stride);
              if (pdVar2 == (double *)0x0) {
                dVar16 = (double)pfVar3[uVar4];
                dVar14 = (double)pfVar3[uVar4 + 1];
                dVar18 = (double)pfVar3[uVar4 + 2];
              }
              else {
                dVar16 = pdVar2[uVar4];
                dVar14 = pdVar2[uVar4 + 1];
                dVar18 = pdVar2[uVar4 + 2];
              }
              dVar16 = dVar18 * this->z + dVar16 * dVar1 + dVar14 * this->y + this->d;
              iVar10 = 0;
              if (ABS(dVar16) < 1.23432101234321e+308) {
                iVar10 = 4;
                dVar17 = dVar16;
                dVar15 = dVar16;
                for (uVar7 = uVar7 + 1; uVar7 < uVar8; uVar7 = uVar7 + iVar6) {
                  dVar16 = dVar17;
                  if (point_index_list[uVar7] < uVar9) {
                    uVar4 = (ulong)(point_index_list[uVar7] * point_list->m_point_stride);
                    if (pdVar2 == (double *)0x0) {
                      dVar14 = (double)pfVar3[uVar4];
                      dVar18 = (double)pfVar3[uVar4 + 1];
                      dVar13 = (double)pfVar3[uVar4 + 2];
                    }
                    else {
                      dVar14 = pdVar2[uVar4];
                      dVar18 = pdVar2[uVar4 + 1];
                      dVar13 = pdVar2[uVar4 + 2];
                    }
                    dVar14 = dVar13 * this->z + dVar14 * dVar1 + dVar18 * this->y + this->d;
                    if (((ABS(dVar14) < 1.23432101234321e+308) &&
                        (dVar16 = dVar14, dVar17 <= dVar14)) && (dVar16 = dVar17, dVar15 < dVar14))
                    {
                      dVar15 = dVar14;
                    }
                  }
                  dVar17 = dVar16;
                }
              }
            }
          } while (((iVar10 == 6) || (iVar10 == 0)) && (uVar7 = uVar7 + iVar6, uVar7 < uVar8));
        }
      }
    }
  }
  OVar19.m_t[1] = dVar15;
  OVar19.m_t[0] = dVar17;
  return (ON_Interval)OVar19.m_t;
}

Assistant:

ON_Interval ON_PlaneEquation::ValueRange(
  size_t point_index_count,
  size_t point_index_stride,
  const unsigned int* point_index_list,
  const class ON_3dPointListRef& point_list
  ) const
{
  ON_Interval value_interval(ON_Interval::EmptyInterval);

  for(;;)
  {
    if ( false == IsValid() )
      break; // invalid plane equation;

    double h;
    const unsigned int vertex_count = point_list.PointCount();
    if ( 0 == vertex_count )
      break;
    const unsigned int point_count = (point_index_count > 0 && point_index_count < (size_t)ON_UNSET_UINT_INDEX)
                                   ? ((unsigned int)point_index_count)
                                   : 0;
    if ( 0 == point_count )
      break;

    if ( 0 != point_index_list )
    {
      const unsigned int point_stride = (point_index_stride > 0 && point_index_stride < (size_t)ON_UNSET_UINT_INDEX)
                                      ? ((unsigned int)point_index_stride)
                                      : 0;
      if ( 0 == point_stride )
        break;
      for ( unsigned int i = 0; i < point_count*point_stride; i += point_stride )
      {
        unsigned int j = point_index_list[i];
        if ( j >= vertex_count )
          continue;
        h = ValueAt(point_list[j]);
        if ( ON_IsValid(h) )
        {
          value_interval.Set(h,h);
          for (i++; i < point_count*point_stride; i+= point_stride )
          {
            unsigned int j_local = point_index_list[i];
            if ( j_local >= vertex_count )
              continue;
            h = ValueAt(point_list[j_local]);
            if ( ON_IsValid(h) )
            {
              if ( h < value_interval.m_t[0] )
                value_interval.m_t[0] = h;
              else if ( h > value_interval.m_t[1] )
                value_interval.m_t[1] = h;
            }
          }
          break;
        }
      }
    }
    else if ( point_count <= vertex_count )
    {
      for ( unsigned int i = 0; i < point_count; i++ )
      {        
        h = ValueAt(point_list[i]);
        if ( ON_IsValid(h) )
        {
          value_interval.Set(h,h);
          for (i++; i < point_count; i++ )
          {
            h = ValueAt(point_list[i]);
            if ( ON_IsValid(h) )
            {
              if ( h < value_interval.m_t[0] )
                value_interval.m_t[0] = h;
              else if ( h > value_interval.m_t[1] )
                value_interval.m_t[1] = h;
            }
          }
          break;
        }
      }
    }

    break;
  }
  return value_interval;
}